

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveImportObj(Parser *parser,int flags)

{
  StringLiteral *this;
  bool bVar1;
  MipsArchType MVar2;
  reference pvVar3;
  size_type sVar4;
  pointer this_00;
  pointer this_01;
  undefined4 in_register_00000034;
  Parser *this_02;
  path local_160;
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  undefined1 local_f0 [8];
  __single_object psxLib;
  undefined1 local_c8 [48];
  undefined1 local_98 [8];
  __single_object attempt;
  Identifier ctorName;
  StringLiteral inputName;
  undefined1 local_40 [8];
  vector<Expression,_std::allocator<Expression>_> list;
  Token *start;
  int flags_local;
  Parser *parser_local;
  
  this_02 = (Parser *)CONCAT44(in_register_00000034,flags);
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Parser::peekToken(this_02,0);
  std::vector<Expression,_std::allocator<Expression>_>::vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_40);
  bVar1 = Parser::parseExpressionList
                    (this_02,(vector<Expression,_std::allocator<Expression>_> *)local_40,1,2);
  if (bVar1) {
    this = (StringLiteral *)((long)&ctorName._name.field_2 + 8);
    StringLiteral::StringLiteral(this);
    pvVar3 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                       ((vector<Expression,_std::allocator<Expression>_> *)local_40,0);
    bVar1 = Expression::evaluateString(pvVar3,this,true);
    if (bVar1) {
      sVar4 = std::vector<Expression,_std::allocator<Expression>_>::size
                        ((vector<Expression,_std::allocator<Expression>_> *)local_40);
      if (sVar4 == 2) {
        Identifier::Identifier((Identifier *)&attempt);
        pvVar3 = std::vector<Expression,_std::allocator<Expression>_>::operator[]
                           ((vector<Expression,_std::allocator<Expression>_> *)local_40,1);
        bVar1 = Expression::evaluateIdentifier(pvVar3,(Identifier *)&attempt);
        if (bVar1) {
          MVar2 = CMipsArchitecture::GetVersion(&Mips);
          if (MVar2 == MARCH_PSX) {
            StringLiteral::path((path *)(local_c8 + 0x10),
                                (StringLiteral *)((long)&ctorName._name.field_2 + 8));
            std::make_unique<DirectiveObjImport,ghc::filesystem::path,Identifier&>
                      ((path *)local_98,(Identifier *)(local_c8 + 0x10));
            ghc::filesystem::path::~path((path *)(local_c8 + 0x10));
            this_00 = std::unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>
                      ::operator->((unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>
                                    *)local_98);
            bVar1 = DirectiveObjImport::isSuccessfullyImported(this_00);
            if (bVar1) {
              std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
              unique_ptr<DirectiveObjImport,std::default_delete<DirectiveObjImport>,void>
                        ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)
                         parser,(unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>
                                 *)local_98);
            }
            else {
              Parser::printError<>
                        (this_02,(Token *)list.
                                          super__Vector_base<Expression,_std::allocator<Expression>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         "Constructor not supported for non-ELF PSX libraries");
              std::make_unique<InvalidCommand>();
              std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
              unique_ptr<InvalidCommand,std::default_delete<InvalidCommand>,void>
                        ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)
                         parser,(unique_ptr<InvalidCommand,_std::default_delete<InvalidCommand>_> *)
                                (local_c8 + 8));
              std::unique_ptr<InvalidCommand,_std::default_delete<InvalidCommand>_>::~unique_ptr
                        ((unique_ptr<InvalidCommand,_std::default_delete<InvalidCommand>_> *)
                         (local_c8 + 8));
            }
            std::unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>::
            ~unique_ptr((unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_> *)
                        local_98);
          }
          else {
            StringLiteral::path((path *)&psxLib,(StringLiteral *)((long)&ctorName._name.field_2 + 8)
                               );
            std::make_unique<DirectiveObjImport,ghc::filesystem::path,Identifier&>
                      ((path *)local_c8,(Identifier *)&psxLib);
            std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
            unique_ptr<DirectiveObjImport,std::default_delete<DirectiveObjImport>,void>
                      ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)
                       parser,(unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>
                               *)local_c8);
            std::unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>::
            ~unique_ptr((unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_> *)
                        local_c8);
            ghc::filesystem::path::~path((path *)&psxLib);
          }
        }
        else {
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                     (nullptr_t)0x0);
        }
        Identifier::~Identifier((Identifier *)&attempt);
      }
      else {
        MVar2 = CMipsArchitecture::GetVersion(&Mips);
        if (MVar2 == MARCH_PSX) {
          StringLiteral::path((path *)(local_118 + 8),
                              (StringLiteral *)((long)&ctorName._name.field_2 + 8));
          std::make_unique<DirectivePsxObjImport,ghc::filesystem::path>((path *)local_f0);
          ghc::filesystem::path::~path((path *)(local_118 + 8));
          this_01 = std::
                    unique_ptr<DirectivePsxObjImport,_std::default_delete<DirectivePsxObjImport>_>::
                    operator->((unique_ptr<DirectivePsxObjImport,_std::default_delete<DirectivePsxObjImport>_>
                                *)local_f0);
          bVar1 = DirectivePsxObjImport::isSuccessfullyImported(this_01);
          if (bVar1) {
            std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
            unique_ptr<DirectivePsxObjImport,std::default_delete<DirectivePsxObjImport>,void>
                      ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)
                       parser,(unique_ptr<DirectivePsxObjImport,_std::default_delete<DirectivePsxObjImport>_>
                               *)local_f0);
          }
          else {
            StringLiteral::path((path *)(local_140 + 8),
                                (StringLiteral *)((long)&ctorName._name.field_2 + 8));
            std::make_unique<DirectiveObjImport,ghc::filesystem::path>((path *)local_118);
            std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
            unique_ptr<DirectiveObjImport,std::default_delete<DirectiveObjImport>,void>
                      ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)
                       parser,(unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>
                               *)local_118);
            std::unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>::
            ~unique_ptr((unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_> *)
                        local_118);
            ghc::filesystem::path::~path((path *)(local_140 + 8));
          }
          std::unique_ptr<DirectivePsxObjImport,_std::default_delete<DirectivePsxObjImport>_>::
          ~unique_ptr((unique_ptr<DirectivePsxObjImport,_std::default_delete<DirectivePsxObjImport>_>
                       *)local_f0);
        }
        else {
          StringLiteral::path(&local_160,(StringLiteral *)((long)&ctorName._name.field_2 + 8));
          std::make_unique<DirectiveObjImport,ghc::filesystem::path>((path *)local_140);
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<DirectiveObjImport,std::default_delete<DirectiveObjImport>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                     (unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_> *)
                     local_140);
          std::unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_>::~unique_ptr
                    ((unique_ptr<DirectiveObjImport,_std::default_delete<DirectiveObjImport>_> *)
                     local_140);
          ghc::filesystem::path::~path(&local_160);
        }
      }
    }
    else {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 (nullptr_t)0x0);
    }
    StringLiteral::~StringLiteral((StringLiteral *)((long)&ctorName._name.field_2 + 8));
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  std::vector<Expression,_std::allocator<Expression>_>::~vector
            ((vector<Expression,_std::allocator<Expression>_> *)local_40);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveImportObj(Parser& parser, int flags)
{
	const Token& start = parser.peekToken();

	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral inputName;
	if (!list[0].evaluateString(inputName,true))
		return nullptr;
	
	if (list.size() == 2)
	{
		Identifier ctorName;
		if (!list[1].evaluateIdentifier(ctorName))
			return nullptr;
		
		if (Mips.GetVersion() == MARCH_PSX)
		{
			auto attempt = std::make_unique<DirectiveObjImport>(inputName.path(),ctorName);
			if (!attempt->isSuccessfullyImported())
			{
				parser.printError(start, "Constructor not supported for non-ELF PSX libraries");
				return std::make_unique<InvalidCommand>();
			}
			else
			{
				return attempt;
			}
		}

		return std::make_unique<DirectiveObjImport>(inputName.path(),ctorName);
	}

	if (Mips.GetVersion() == MARCH_PSX)
	{
		// Fallback to ELF, if the PSX library importer fails.
		auto psxLib = std::make_unique<DirectivePsxObjImport>(inputName.path());
		if (!psxLib->isSuccessfullyImported())
			return std::make_unique<DirectiveObjImport>(inputName.path());
		else
			return psxLib;
	}
	else
	{
		return std::make_unique<DirectiveObjImport>(inputName.path());
	}
}